

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall FlowGraph::SortLoopLists(FlowGraph *this)

{
  NodeBase **this_00;
  SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  uint uVar2;
  bool bVar3;
  BasicBlock *pBVar4;
  Type *data;
  Type *ppBVar5;
  Loop *this_01;
  uint uVar6;
  undefined1 local_70 [8];
  EditingIterator iter;
  EditingIterator newIter;
  
  this_01 = this->loopList;
  if (this_01 != (Loop *)0x0) {
    this_00 = &iter.super_EditingIterator.last;
    do {
      pBVar4 = Loop::GetHeadBlock(this_01);
      uVar6 = pBVar4->number;
      pSVar1 = &this_01->blockList;
      iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
      local_70 = (undefined1  [8])pSVar1;
      iter.super_EditingIterator.super_Iterator.list =
           &pSVar1->super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>;
      bVar3 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                        ((EditingIterator *)local_70);
      while (bVar3 != false) {
        data = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)local_70);
        uVar2 = uVar6;
        if ((((*data)->field_0x18 & 1) == 0) && (uVar2 = (*data)->number, uVar2 < uVar6)) {
          SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
          UnlinkCurrentNode((EditingIterator *)local_70);
          iter.super_EditingIterator.last = (NodeBase *)pSVar1;
          do {
            bVar3 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
                    Next((EditingIterator *)this_00);
            if (!bVar3) break;
            ppBVar5 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                ((Iterator *)this_00);
          } while ((((*ppBVar5)->field_0x18 & 1) != 0) || ((*ppBVar5)->number <= (*data)->number));
          SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::InsertBefore
                    ((EditingIterator *)this_00,
                     (ArenaAllocator *)iter.super_EditingIterator.last[2].next,data);
          uVar2 = uVar6;
        }
        uVar6 = uVar2;
        bVar3 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                          ((EditingIterator *)local_70);
      }
      this_01 = this_01->next;
    } while (this_01 != (Loop *)0x0);
  }
  return;
}

Assistant:

void
FlowGraph::SortLoopLists()
{
    // Sort the blocks in loopList
    for (Loop *loop = this->loopList; loop; loop = loop->next)
    {
        unsigned int lastBlockNumber = loop->GetHeadBlock()->GetBlockNum();
        // Insertion sort as the blockList is almost sorted in the loop.
        FOREACH_BLOCK_IN_LOOP_EDITING(block, loop, iter)
        {
            if (lastBlockNumber <= block->GetBlockNum())
            {
                lastBlockNumber = block->GetBlockNum();
            }
            else
            {
                iter.UnlinkCurrent();
                FOREACH_BLOCK_IN_LOOP_EDITING(insertBlock,loop,newIter)
                {
                    if (insertBlock->GetBlockNum() > block->GetBlockNum())
                    {
                        break;
                    }
                }NEXT_BLOCK_IN_LOOP_EDITING;
                newIter.InsertBefore(block);
            }
        }NEXT_BLOCK_IN_LOOP_EDITING;
    }
}